

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

IterateResult __thiscall
gl3cts::ParenthesisInLayoutQualifierIntegerValuesTest::iterate
          (ParenthesisInLayoutQualifierIntegerValuesTest *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *pCVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  char *local_3c0;
  char *local_388;
  char *local_380;
  MessageBuilder local_370;
  MessageBuilder local_1e0;
  undefined4 local_5c;
  deUint32 local_58;
  uint n_cs_body_parts;
  deUint32 local_50;
  ApiType local_4c;
  char *local_48;
  char *cs_body_parts [2];
  bool local_2d;
  int local_2c;
  int iStack_28;
  bool expected_outcome;
  GLint compile_status;
  GLint link_status;
  bool result;
  Functions *gl;
  ParenthesisInLayoutQualifierIntegerValuesTest *pPStack_10;
  ContextType context_type;
  ParenthesisInLayoutQualifierIntegerValuesTest *this_local;
  
  pPStack_10 = this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  gl._4_4_ = (*pRVar5->_vptr_RenderContext[2])();
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  _link_status = CONCAT44(extraout_var,iVar2);
  compile_status._3_1_ = 1;
  iStack_28 = 1;
  local_2c = 1;
  cs_body_parts[1]._4_4_ = gl._4_4_;
  cs_body_parts[1]._0_4_ = glu::ApiType::core(4,4);
  local_2d = glu::contextSupports((ContextType)cs_body_parts[1]._4_4_,cs_body_parts[1]._0_4_);
  local_4c.m_bits = gl._4_4_;
  local_50 = (deUint32)glu::ApiType::core(4,3);
  bVar1 = glu::contextSupports((ContextType)local_4c.m_bits,(ApiType)local_50);
  if (bVar1) {
    n_cs_body_parts = gl._4_4_;
    local_58 = (deUint32)glu::ApiType::core(4,4);
    bVar1 = glu::contextSupports((ContextType)n_cs_body_parts,(ApiType)local_58);
    if (bVar1) {
      local_388 = "#version 440 core\n";
    }
    else {
      local_388 = "#version 430 core\n";
    }
    local_380 = local_388;
  }
  else {
    local_380 = "#version 420 core\n";
  }
  local_48 = local_380;
  cs_body_parts[0] = iterate::cs_body_core;
  local_5c = 2;
  pCVar6 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(pCVar6,"GL_ARB_compute_shader");
  if (bVar1) {
    GVar3 = (**(code **)(_link_status + 0x3f0))(0x91b9);
    this->m_cs_id = GVar3;
    GVar3 = (**(code **)(_link_status + 0x3c8))();
    this->m_po_id = GVar3;
    dVar4 = (**(code **)(_link_status + 0x800))();
    glu::checkError(dVar4,"glCreateShader() and/or glCraeteProgram() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x5fa);
    dVar4 = (**(code **)(_link_status + 0x800))();
    glu::checkError(dVar4,"glCreateProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x5fc);
    (**(code **)(_link_status + 0x12b8))(this->m_cs_id,2,&local_48,0);
    dVar4 = (**(code **)(_link_status + 0x800))();
    glu::checkError(dVar4,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x5ff);
    pCVar6 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar6,"GL_ARB_enhanced_layouts");
    if (bVar1) {
      local_2d = true;
    }
    (**(code **)(_link_status + 0x248))(this->m_cs_id);
    dVar4 = (**(code **)(_link_status + 0x800))();
    glu::checkError(dVar4,"glCompileShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x611);
    (**(code **)(_link_status + 0xa70))(this->m_cs_id,0x8b81,&local_2c);
    dVar4 = (**(code **)(_link_status + 0x800))();
    glu::checkError(dVar4,"glGetShaderiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x614);
    if ((local_2c != 0) || (local_2d != false)) {
      (**(code **)(_link_status + 0x10))(this->m_po_id,this->m_cs_id);
      dVar4 = (**(code **)(_link_status + 0x800))();
      glu::checkError(dVar4,"glAttachShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                      ,0x61c);
      (**(code **)(_link_status + 0xce8))(this->m_po_id);
      dVar4 = (**(code **)(_link_status + 0x800))();
      glu::checkError(dVar4,"glLinkProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                      ,0x61f);
      (**(code **)(_link_status + 0x9d8))(this->m_po_id,0x8b82,&stack0xffffffffffffffd8);
      dVar4 = (**(code **)(_link_status + 0x800))();
      glu::checkError(dVar4,"glGetProgramiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                      ,0x622);
      if ((iStack_28 != 0) || (local_2d != false)) {
        if ((local_2d == false) || ((local_2c != 0 && (iStack_28 != 0)))) {
          if ((local_2d == false) && ((local_2c == 1 && (iStack_28 == 1)))) {
            pTVar7 = tcu::TestContext::getLog
                               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_370,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (&local_370,
                                (char (*) [108])
                                "A compute program was expected not to compile and link, but both processes have been executed successfully."
                               );
            tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_370);
            compile_status._3_1_ = 0;
          }
        }
        else {
          pTVar7 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_1e0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (&local_1e0,
                              (char (*) [119])
                              "A compute program was expected to link successfully, but either the compilation and/or linking process has/have failed"
                             );
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_1e0);
          compile_status._3_1_ = 0;
        }
      }
    }
  }
  if ((compile_status._3_1_ & 1) == 0) {
    local_3c0 = "Fail";
  }
  else {
    local_3c0 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (uint)((compile_status._3_1_ & 1) == 0),local_3c0);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ParenthesisInLayoutQualifierIntegerValuesTest::iterate()
{
	/* Only execute the test on implementations supporting GL_ARB_compute_shader */
	const glu::ContextType context_type = m_context.getRenderContext().getType();
	const glw::Functions&  gl			= m_context.getRenderContext().getFunctions();
	bool				   result		= true;

	glw::GLint link_status		= GL_TRUE;
	glw::GLint compile_status   = GL_TRUE;
	bool	   expected_outcome = glu::contextSupports(context_type, glu::ApiType::core(4, 4));

	/* Prepare a compute shader program */
	static const char* cs_body_core = "\n"
									  "layout(local_size_x = (4) ) in;\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "}\n";

	const char* cs_body_parts[] = { (!glu::contextSupports(context_type, glu::ApiType::core(4, 3))) ?
										"#version 420 core\n" :
										(!glu::contextSupports(context_type, glu::ApiType::core(4, 4))) ?
										"#version 430 core\n" :
										"#version 440 core\n",
									cs_body_core };
	const unsigned int n_cs_body_parts =
		static_cast<const unsigned int>(sizeof(cs_body_parts) / sizeof(cs_body_parts[0]));

	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_compute_shader"))
	{
		goto end;
	}

	m_cs_id = gl.createShader(GL_COMPUTE_SHADER);
	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() and/or glCraeteProgram() call(s) failed.");

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	gl.shaderSource(m_cs_id, n_cs_body_parts, cs_body_parts, DE_NULL); /* length */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

	/* Try to compile the shader object.
	 *
	 * For GL contexts BEFORE 4.40, the test passes if either
	 * the compilation or the linking process fails.
	 *
	 * For GL contexts OF VERSION 4.40 or newer, the test passes
	 * if both the compilation and the linking process succeed.
	 *
	 * If GL_ARB_enhanced_layouts is supported, the latter holds for <= GL4.4 contexts.
	 **/
	if (m_context.getContextInfo().isExtensionSupported("GL_ARB_enhanced_layouts"))
	{
		expected_outcome = true;
	}

	gl.compileShader(m_cs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

	gl.getShaderiv(m_cs_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

	if (compile_status == GL_FALSE && !expected_outcome)
	{
		goto end;
	}

	gl.attachShader(m_po_id, m_cs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");

	gl.linkProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status == GL_FALSE && !expected_outcome)
	{
		goto end;
	}

	if (expected_outcome && (compile_status == GL_FALSE || link_status == GL_FALSE))
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "A compute program was expected to link successfully, but either the "
							  "compilation and/or linking process has/have failed"
						   << tcu::TestLog::EndMessage;

		result = false;
	}
	else if (!expected_outcome && (compile_status == GL_TRUE && link_status == GL_TRUE))
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "A compute program was expected not to compile and link, but both processes "
							  "have been executed successfully."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

end:
	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}